

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O1

void __thiscall ValueSymbol::~ValueSymbol(ValueSymbol *this)

{
  pointer pcVar1;
  
  (this->super_FamilySymbol).super_TripleSymbol.super_SleighSymbol._vptr_SleighSymbol =
       (_func_int **)&PTR__ValueSymbol_003cc9d8;
  if (&this->patval->super_PatternExpression != (PatternExpression *)0x0) {
    PatternExpression::release(&this->patval->super_PatternExpression);
  }
  (this->super_FamilySymbol).super_TripleSymbol.super_SleighSymbol._vptr_SleighSymbol =
       (_func_int **)&PTR__SleighSymbol_003ccf20;
  pcVar1 = (this->super_FamilySymbol).super_TripleSymbol.super_SleighSymbol.name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_FamilySymbol).super_TripleSymbol.super_SleighSymbol.name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

ValueSymbol::~ValueSymbol(void)

{
  if (patval != (PatternValue *)0)
    PatternExpression::release(patval);
}